

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O1

ByteData * __thiscall
cfd::core::Block::SerializeBlockHeader(ByteData *__return_storage_ptr__,Block *this)

{
  Serializer obj;
  ByteData local_58;
  Serializer local_40;
  
  Serializer::Serializer(&local_40);
  Serializer::AddDirectNumber(&local_40,(this->header_).version);
  BlockHash::GetData(&local_58,&(this->header_).prev_block_hash);
  Serializer::AddDirectBytes(&local_40,&local_58);
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  BlockHash::GetData(&local_58,&(this->header_).merkle_root_hash);
  Serializer::AddDirectBytes(&local_40,&local_58);
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  Serializer::AddDirectNumber(&local_40,(this->header_).time);
  Serializer::AddDirectNumber(&local_40,(this->header_).bits);
  Serializer::AddDirectNumber(&local_40,(this->header_).nonce);
  Serializer::Output(__return_storage_ptr__,&local_40);
  local_40._vptr_Serializer = (_func_int **)&PTR__Serializer_0025a828;
  if (local_40.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Block::SerializeBlockHeader() const {
  Serializer obj;
  obj.AddDirectNumber(header_.version);
  obj.AddDirectBytes(header_.prev_block_hash.GetData());
  obj.AddDirectBytes(header_.merkle_root_hash.GetData());
  obj.AddDirectNumber(header_.time);
  obj.AddDirectNumber(header_.bits);
  obj.AddDirectNumber(header_.nonce);
  return obj.Output();
}